

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O1

void __thiscall QStyleOptionHeader::QStyleOptionHeader(QStyleOptionHeader *this,int version)

{
  QStyleOption::QStyleOption(&this->super_QStyleOption,version,8);
  this->section = 0;
  (this->text).d.d = (Data *)0x0;
  (this->text).d.ptr = (char16_t *)0x0;
  (this->text).d.size = 0;
  (this->textAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i = 1;
  QIcon::QIcon(&this->icon);
  this->iconAlignment = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x1;
  this->position = Beginning;
  this->selectedPosition = NotAdjacent;
  this->sortIndicator = None;
  this->orientation = Horizontal;
  return;
}

Assistant:

QStyleOptionHeader::QStyleOptionHeader(int version)
    : QStyleOption(version, SO_Header),
      section(0), textAlignment(Qt::AlignLeft), iconAlignment(Qt::AlignLeft),
      position(QStyleOptionHeader::Beginning),
      selectedPosition(QStyleOptionHeader::NotAdjacent), sortIndicator(None),
      orientation(Qt::Horizontal)
{
}